

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  error_category *peVar3;
  bool bVar4;
  file_status fs;
  error_code tec;
  iterator __begin2;
  error_code tmp_ec;
  path current;
  string_type part;
  iterator __end2;
  uint local_138 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [64];
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  std::error_code::clear(ec);
  path::begin((iterator *)local_110,p);
  path::end((iterator *)local_70,p);
  bVar4 = false;
  do {
    if (local_110._24_8_ == local_70._24_8_) {
LAB_0014cb76:
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
      std::__cxx11::string::~string((string *)(local_110 + 0x20));
      std::__cxx11::string::~string((string *)&local_b0);
      return bVar4;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)(local_110 + 0x20));
    path::append<std::__cxx11::string>((path *)&local_b0,&local_90);
    path::root_name((path *)&local_130,p);
    bVar1 = std::operator!=(&local_b0,&local_130);
    if (bVar1) {
      path::root_path((path *)&local_d0,p);
      bVar2 = std::operator!=(&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_130);
      bVar1 = true;
      if (bVar2) {
        local_130._M_dataplus._M_p._0_4_ = 0;
        peVar3 = (error_category *)std::_V2::system_category();
        local_130._M_string_length = (size_type)peVar3;
        status((filesystem *)local_138,(path *)&local_b0,(error_code *)&local_130);
        if ((int)local_130._M_dataplus._M_p == 0) {
          if (local_138[0] < 2) goto LAB_0014caea;
          bVar1 = true;
          if (local_138[0] != 3) {
            ec->_M_value = 0x11;
            ec->_M_cat = peVar3;
            goto LAB_0014cb32;
          }
        }
        else if (local_138[0] == 1) {
LAB_0014caea:
          create_directory((path *)&local_b0,ec);
          bVar1 = true;
          if (ec->_M_value == 0) {
            bVar4 = true;
          }
          else {
            local_d0._M_dataplus._M_p._0_4_ = 0;
            local_d0._M_string_length = (size_type)peVar3;
            bVar2 = is_directory((path *)&local_b0,(error_code *)&local_d0);
            if (!bVar2) goto LAB_0014cb32;
            std::error_code::clear(ec);
            bVar4 = true;
          }
        }
        else {
          *(ulong *)ec = CONCAT44(local_130._M_dataplus._M_p._4_4_,(int)local_130._M_dataplus._M_p);
          ec->_M_cat = (error_category *)local_130._M_string_length;
LAB_0014cb32:
          bVar1 = false;
        }
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_130);
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&local_90);
    if (!bVar1) {
      bVar4 = false;
      goto LAB_0014cb76;
    }
    path::iterator::operator++((iterator *)local_110);
  } while( true );
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    for (path::string_type part : p) {
        current /= part;
        if (current != p.root_name() && current != p.root_path()) {
            std::error_code tec;
            auto fs = status(current, tec);
            if (tec && fs.type() != file_type::not_found) {
                ec = tec;
                return false;
            }
            if (!exists(fs)) {
                create_directory(current, ec);
                if (ec) {
                    std::error_code tmp_ec;
                    if (is_directory(current, tmp_ec)) {
                        ec.clear();
                    } else {
                        return false;
                    }
                }
                didCreate = true;
            }
#ifndef LWG_2935_BEHAVIOUR
            else if (!is_directory(fs)) {
                ec = detail::make_error_code(detail::portable_error::exists);
                return false;
            }
#endif
        }
    }
    return didCreate;
}